

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_ae086::____C_A_T_C_H____T_E_S_T____24::test(____C_A_T_C_H____T_E_S_T____24 *this)

{
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  bool bVar1;
  ExprLhs<const_unsigned_long_&> this_00;
  ExprLhs<const_unsigned_long_&> EVar2;
  reference pEVar3;
  ExprLhs<const_unsigned_long_&> macroName;
  ExprLhs<const_std::vector<entityx::Entity,_std::allocator<entityx::Entity>_>_&> expr;
  Entity EVar4;
  AssertionHandler catchAssertionHandler_3;
  AssertionHandler catchAssertionHandler_2;
  Entity e;
  iterator __end1;
  iterator __begin1;
  vector<entityx::Entity,_std::allocator<entityx::Entity>_> *__range1;
  AssertionHandler catchAssertionHandler_1;
  int i;
  vector<entityx::Entity,_std::allocator<entityx::Entity>_> entities;
  AssertionHandler catchAssertionHandler;
  EntityDestroyedEventReceiver receiver;
  ITransientExpression *in_stack_fffffffffffffbc8;
  EntityDestroyedEventReceiver *in_stack_fffffffffffffbd0;
  EntityDestroyedEventReceiver *this_01;
  StringRef *in_stack_fffffffffffffbd8;
  AssertionHandler *in_stack_fffffffffffffbe0;
  AssertionHandler *this_02;
  char *in_stack_fffffffffffffbe8;
  size_type in_stack_fffffffffffffbf0;
  SourceLineInfo *this_03;
  EntityManager *in_stack_fffffffffffffc00;
  undefined1 local_388 [104];
  size_type local_320;
  undefined8 local_318;
  unsigned_long *local_308;
  EntityDestroyedEventReceiver *in_stack_fffffffffffffd28;
  EventManager *in_stack_fffffffffffffd30;
  AssertionHandler local_2c0;
  EntityManager *local_258;
  uint64_t uStack_250;
  Entity *local_248;
  __normal_iterator<entityx::Entity_*,_std::vector<entityx::Entity,_std::allocator<entityx::Entity>_>_>
  local_240;
  undefined1 *local_238;
  size_type local_230;
  undefined8 local_228;
  unsigned_long *local_218;
  SourceLineInfo local_1d0;
  StringRef local_1c0;
  EntityManager *local_168;
  uint64_t local_160;
  int local_154;
  undefined1 local_150 [24];
  size_type local_138;
  undefined8 local_130;
  unsigned_long *local_120;
  SourceLineInfo local_d8;
  StringRef local_c8;
  vector<entityx::Entity,_std::allocator<entityx::Entity>_> local_20;
  
  test::EntityDestroyedEventReceiver::EntityDestroyedEventReceiver(in_stack_fffffffffffffbd0);
  entityx::EventManager::
  subscribe<entityx::EntityDestroyedEvent,(anonymous_namespace)::____C_A_T_C_H____T_E_S_T____24::test()::EntityDestroyedEventReceiver>
            (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  local_c8 = operator____catch_sr
                       ((char *)in_stack_fffffffffffffbd0,(size_t)in_stack_fffffffffffffbc8);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_d8,
             "/workspace/llm4binary/github/license_c_cmakelists/alecthomas[P]entityx/entityx/Entity_test.cc"
             ,0x149);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffffbe0,(char *)in_stack_fffffffffffffbd8);
  capturedExpression.m_size = in_stack_fffffffffffffbf0;
  capturedExpression.m_start = in_stack_fffffffffffffbe8;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,
             (SourceLineInfo *)in_stack_fffffffffffffbd0,capturedExpression,
             (Flags)((ulong)in_stack_fffffffffffffbc8 >> 0x20));
  local_130 = 0;
  this_00 = Catch::Decomposer::operator<=
                      ((Decomposer *)in_stack_fffffffffffffbc8,(unsigned_long *)0x296587);
  local_120 = this_00.m_lhs;
  local_138 = Catch::clara::std::vector<entityx::Entity,_std::allocator<entityx::Entity>_>::size
                        (&local_20);
  Catch::ExprLhs<unsigned_long_const&>::operator==
            ((ExprLhs<const_unsigned_long_&> *)this_00.m_lhs,
             (unsigned_long *)in_stack_fffffffffffffc00);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  Catch::BinaryExpr<const_unsigned_long_&,_const_unsigned_long_&>::~BinaryExpr
            ((BinaryExpr<const_unsigned_long_&,_const_unsigned_long_&> *)0x2965f3);
  Catch::AssertionHandler::complete((AssertionHandler *)in_stack_fffffffffffffbd0);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)in_stack_fffffffffffffbd0);
  Catch::clara::std::vector<entityx::Entity,_std::allocator<entityx::Entity>_>::vector
            ((vector<entityx::Entity,_std::allocator<entityx::Entity>_> *)0x296695);
  for (local_154 = 0; local_154 < 10; local_154 = local_154 + 1) {
    EVar4 = entityx::EntityManager::create((EntityManager *)in_stack_fffffffffffffbe0);
    local_160 = (uint64_t)EVar4.id_.id_;
    in_stack_fffffffffffffc00 = EVar4.manager_;
    local_168 = in_stack_fffffffffffffc00;
    Catch::clara::std::vector<entityx::Entity,_std::allocator<entityx::Entity>_>::push_back
              ((vector<entityx::Entity,_std::allocator<entityx::Entity>_> *)
               in_stack_fffffffffffffbd0,(value_type *)in_stack_fffffffffffffbc8);
  }
  local_1c0 = operator____catch_sr
                        ((char *)in_stack_fffffffffffffbd0,(size_t)in_stack_fffffffffffffbc8);
  this_03 = &local_1d0;
  Catch::SourceLineInfo::SourceLineInfo
            (this_03,
             "/workspace/llm4binary/github/license_c_cmakelists/alecthomas[P]entityx/entityx/Entity_test.cc"
             ,0x14e);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffffbe0,(char *)in_stack_fffffffffffffbd8);
  capturedExpression_00.m_size = (size_type)this_03;
  capturedExpression_00.m_start = in_stack_fffffffffffffbe8;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,
             (SourceLineInfo *)in_stack_fffffffffffffbd0,capturedExpression_00,
             (Flags)((ulong)in_stack_fffffffffffffbc8 >> 0x20));
  local_228 = 0;
  EVar2 = Catch::Decomposer::operator<=
                    ((Decomposer *)in_stack_fffffffffffffbc8,(unsigned_long *)0x296814);
  local_218 = EVar2.m_lhs;
  local_230 = Catch::clara::std::vector<entityx::Entity,_std::allocator<entityx::Entity>_>::size
                        (&local_20);
  Catch::ExprLhs<unsigned_long_const&>::operator==
            ((ExprLhs<const_unsigned_long_&> *)this_00.m_lhs,
             (unsigned_long *)in_stack_fffffffffffffc00);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  Catch::BinaryExpr<const_unsigned_long_&,_const_unsigned_long_&>::~BinaryExpr
            ((BinaryExpr<const_unsigned_long_&,_const_unsigned_long_&> *)0x296880);
  Catch::AssertionHandler::complete((AssertionHandler *)in_stack_fffffffffffffbd0);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)in_stack_fffffffffffffbd0);
  local_238 = local_150;
  local_240._M_current =
       (Entity *)
       Catch::clara::std::vector<entityx::Entity,_std::allocator<entityx::Entity>_>::begin
                 ((vector<entityx::Entity,_std::allocator<entityx::Entity>_> *)
                  in_stack_fffffffffffffbc8);
  local_248 = (Entity *)
              Catch::clara::std::vector<entityx::Entity,_std::allocator<entityx::Entity>_>::end
                        ((vector<entityx::Entity,_std::allocator<entityx::Entity>_> *)
                         in_stack_fffffffffffffbc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<entityx::Entity_*,_std::vector<entityx::Entity,_std::allocator<entityx::Entity>_>_>
                        *)in_stack_fffffffffffffbd0,
                       (__normal_iterator<entityx::Entity_*,_std::vector<entityx::Entity,_std::allocator<entityx::Entity>_>_>
                        *)in_stack_fffffffffffffbc8);
    if (!bVar1) break;
    pEVar3 = __gnu_cxx::
             __normal_iterator<entityx::Entity_*,_std::vector<entityx::Entity,_std::allocator<entityx::Entity>_>_>
             ::operator*(&local_240);
    local_258 = pEVar3->manager_;
    uStack_250 = (pEVar3->id_).id_;
    entityx::Entity::destroy();
    __gnu_cxx::
    __normal_iterator<entityx::Entity_*,_std::vector<entityx::Entity,_std::allocator<entityx::Entity>_>_>
    ::operator++(&local_240);
  }
  local_2c0.m_assertionInfo.lineInfo =
       (SourceLineInfo)
       operator____catch_sr((char *)in_stack_fffffffffffffbd0,(size_t)in_stack_fffffffffffffbc8);
  this_02 = &local_2c0;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)this_02,
             "/workspace/llm4binary/github/license_c_cmakelists/alecthomas[P]entityx/entityx/Entity_test.cc"
             ,0x152);
  Catch::StringRef::StringRef((StringRef *)this_02,(char *)in_stack_fffffffffffffbd8);
  capturedExpression_01.m_size = (size_type)this_03;
  capturedExpression_01.m_start = (char *)EVar2.m_lhs;
  Catch::AssertionHandler::AssertionHandler
            (this_02,in_stack_fffffffffffffbd8,(SourceLineInfo *)in_stack_fffffffffffffbd0,
             capturedExpression_01,(Flags)((ulong)in_stack_fffffffffffffbc8 >> 0x20));
  local_318 = 10;
  macroName = Catch::Decomposer::operator<=
                        ((Decomposer *)in_stack_fffffffffffffbc8,(unsigned_long *)0x296a76);
  local_308 = macroName.m_lhs;
  local_320 = Catch::clara::std::vector<entityx::Entity,_std::allocator<entityx::Entity>_>::size
                        (&local_20);
  Catch::ExprLhs<unsigned_long_const&>::operator==
            ((ExprLhs<const_unsigned_long_&> *)this_00.m_lhs,
             (unsigned_long *)in_stack_fffffffffffffc00);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  Catch::BinaryExpr<const_unsigned_long_&,_const_unsigned_long_&>::~BinaryExpr
            ((BinaryExpr<const_unsigned_long_&,_const_unsigned_long_&> *)0x296ae2);
  Catch::AssertionHandler::complete((AssertionHandler *)in_stack_fffffffffffffbd0);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)in_stack_fffffffffffffbd0);
  local_388._16_16_ =
       (undefined1  [16])
       operator____catch_sr((char *)in_stack_fffffffffffffbd0,(size_t)in_stack_fffffffffffffbc8);
  this_01 = (EntityDestroyedEventReceiver *)local_388;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)this_01,
             "/workspace/llm4binary/github/license_c_cmakelists/alecthomas[P]entityx/entityx/Entity_test.cc"
             ,0x153);
  Catch::StringRef::StringRef((StringRef *)this_02,(char *)macroName.m_lhs);
  capturedExpression_02.m_size = (size_type)this_03;
  capturedExpression_02.m_start = (char *)EVar2.m_lhs;
  Catch::AssertionHandler::AssertionHandler
            (this_02,(StringRef *)macroName.m_lhs,(SourceLineInfo *)this_01,capturedExpression_02,
             (Flags)((ulong)in_stack_fffffffffffffbc8 >> 0x20));
  expr = Catch::Decomposer::operator<=
                   ((Decomposer *)in_stack_fffffffffffffbc8,
                    (vector<entityx::Entity,_std::allocator<entityx::Entity>_> *)0x296bf7);
  Catch::ExprLhs<std::vector<entityx::Entity,std::allocator<entityx::Entity>>const&>::operator==
            ((ExprLhs<const_std::vector<entityx::Entity,_std::allocator<entityx::Entity>_>_&> *)
             this_00.m_lhs,
             (vector<entityx::Entity,_std::allocator<entityx::Entity>_> *)in_stack_fffffffffffffc00)
  ;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)this_01,(ITransientExpression *)expr.m_lhs);
  Catch::
  BinaryExpr<const_std::vector<entityx::Entity,_std::allocator<entityx::Entity>_>_&,_const_std::vector<entityx::Entity,_std::allocator<entityx::Entity>_>_&>
  ::~BinaryExpr((BinaryExpr<const_std::vector<entityx::Entity,_std::allocator<entityx::Entity>_>_&,_const_std::vector<entityx::Entity,_std::allocator<entityx::Entity>_>_&>
                 *)0x296c3d);
  Catch::AssertionHandler::complete((AssertionHandler *)this_01);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)this_01);
  Catch::clara::std::vector<entityx::Entity,_std::allocator<entityx::Entity>_>::~vector
            ((vector<entityx::Entity,_std::allocator<entityx::Entity>_> *)this_02);
  test::EntityDestroyedEventReceiver::~EntityDestroyedEventReceiver(this_01);
  return;
}

Assistant:

void receive(const EntityDestroyedEvent &event) {
      destroyed.push_back(event.entity);
    }